

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.h
# Opt level: O3

void __thiscall
icu_63::ContractionsAndExpansions::ContractionsAndExpansions
          (ContractionsAndExpansions *this,UnicodeSet *con,UnicodeSet *exp,CESink *s,UBool prefixes)

{
  this->data = (CollationData *)0x0;
  this->contractions = con;
  this->expansions = exp;
  this->sink = s;
  this->addPrefixes = prefixes;
  this->checkTailored = '\0';
  UnicodeSet::UnicodeSet(&this->tailored);
  UnicodeSet::UnicodeSet(&this->ranges);
  (this->unreversedPrefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b2258;
  (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags = 2;
  this->suffix = (UnicodeString *)0x0;
  this->errorCode = U_ZERO_ERROR;
  return;
}

Assistant:

ContractionsAndExpansions(UnicodeSet *con, UnicodeSet *exp, CESink *s, UBool prefixes)
            : data(NULL),
              contractions(con), expansions(exp),
              sink(s),
              addPrefixes(prefixes),
              checkTailored(0),
              suffix(NULL),
              errorCode(U_ZERO_ERROR) {}